

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetBooks.cpp
# Opt level: O0

void __thiscall GetBooks::operator()(GetBooks *this)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  reference this_00;
  reference pvVar5;
  void *this_01;
  HttpRequest *pHVar6;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *iter;
  iterator __end2;
  iterator __begin2;
  json *__range2;
  json Json;
  Connection local_60 [6];
  unsigned_short sign;
  string reply;
  string local_30 [32];
  GetBooks *local_10;
  GetBooks *this_local;
  
  local_10 = this;
  bVar1 = Session::IsConnected((this->super_Event).m_Owner);
  if (bVar1) {
    Session::GetToken_abi_cxx11_((this->super_Event).m_Owner);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pHVar6 = &(this->super_Event).m_Request;
      HttpRequest::SetRequest(pHVar6,"GET","/api/v1/tema/library/books","HTTP/1.1","");
      HttpRequest::SetHost(pHVar6,"ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
      HttpRequest::ClearHeaders(pHVar6);
      HttpRequest::AddHeader(pHVar6,"Connection","keep-alive");
      Session::GetToken_abi_cxx11_((this->super_Event).m_Owner);
      std::operator+((char *)local_30,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Bearer ")
      ;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      HttpRequest::AddHeader(pHVar6,"Authorization",pcVar4);
      std::__cxx11::string::~string(local_30);
      pHVar6 = &(this->super_Event).m_Request;
      HttpRequest::ClearCookies(pHVar6);
      Session::GetConnectSid_abi_cxx11_((this->super_Event).m_Owner);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      HttpRequest::AddCookie(pHVar6,"connect.sid",pcVar4);
      HttpRequest::SetData(pHVar6,"");
      Session::OpenConnection((this->super_Event).m_Owner);
      HttpRequest::Send(pHVar6,(this->super_Event).m_Owner);
      Connection::ReceiveHttps_abi_cxx11_(local_60,(this->super_Event).m_Owner);
      Session::CloseConnection((this->super_Event).m_Owner);
      Json.m_value.number_unsigned._6_2_ = HttpReply::ExtractSign((string *)local_60);
      if (Json.m_value.number_integer._6_2_ == 200) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&__range2,(nullptr_t)0x0);
        HttpReply::ExtractData
                  ((string *)local_60,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&__range2);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::begin((iterator *)&__end2.m_it.primitive_iterator,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&__range2);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::end((iterator *)&iter,
              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)&__range2);
        while( true ) {
          bVar1 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)&__end2.m_it.primitive_iterator,
                               (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)&iter);
          if (!bVar1) break;
          this_00 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&__end2.m_it.primitive_iterator);
          poVar2 = std::operator<<((ostream *)&std::cout,"Id: ");
          pvVar5 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_00,"id");
          poVar2 = nlohmann::operator<<(poVar2,pvVar5);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          poVar2 = std::operator<<((ostream *)&std::cout,"Title: ");
          pvVar5 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_00,"title");
          poVar2 = nlohmann::operator<<(poVar2,pvVar5);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&__end2.m_it.primitive_iterator);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&__range2);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Get books failed ");
        poVar2 = std::operator<<(poVar2,"error ");
        this_01 = (void *)std::ostream::operator<<(poVar2,Json.m_value.number_unsigned._6_2_);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::~string((string *)local_60);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "To proceed this command you need library access");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"You are not connected");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Please login to proceed this command");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void GetBooks::operator()() {
    using namespace std;
    if (!m_Owner->IsConnected()) {
        cout << "You are not connected" << endl;
        cout << "Please login to proceed this command" << endl;
        return;
    }
    else if (m_Owner->GetToken().empty()) {
        cout << "To proceed this command you need library access" << endl;
        return;
    }
    m_Request.SetRequest("GET", "/api/v1/tema/library/books", "HTTP/1.1");
    m_Request.SetHost("ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
    m_Request.ClearHeaders();
    m_Request.AddHeader("Connection", "keep-alive");
    m_Request.AddHeader("Authorization", ("Bearer " + m_Owner->GetToken()).c_str());
    m_Request.ClearCookies();
    m_Request.AddCookie("connect.sid", m_Owner->GetConnectSid().c_str());
    m_Request.SetData("");
    m_Owner->OpenConnection();
    m_Request.Send(*m_Owner);
    std::string reply = Connection::ReceiveHttps(*m_Owner);
    m_Owner->CloseConnection();
    unsigned short sign = HttpReply::ExtractSign(reply);
    if (sign == 200) {
        json Json;
        HttpReply::ExtractData(reply, Json);
        for (auto & iter : Json) {
            cout << "Id: " << iter["id"] << endl;
            cout << "Title: " << iter["title"] << endl;
            cout << endl;
        }
    }
    else {
        cout << "Get books failed " << "error " << sign << std::endl;
    }
}